

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_source_element(JSParseState *s)

{
  uint uVar1;
  JSFunctionDef *pJVar2;
  JSModuleDef *pJVar3;
  JSAtomStruct *pJVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  JSAtom import_name;
  int iVar9;
  JSAtom JVar10;
  ulong uVar11;
  JSExportEntry *pJVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  JSParseExportEnum export_flag;
  char *fmt;
  JSContext *ctx;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  uint8_t *p;
  JSFunctionDef **in_stack_ffffffffffffffb0;
  uint8_t *local_48;
  long local_40;
  JSContext *local_38;
  
  iVar8 = (s->token).val;
  if (iVar8 == -0x3b) {
LAB_001511ab:
    iVar8 = js_parse_function_decl2
                      (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,(JSAtom)(s->token).ptr,
                       (uint8_t *)(ulong)(uint)(s->token).line_num,0,JS_PARSE_EXPORT_NONE,
                       in_stack_ffffffffffffffb0);
    goto LAB_00151273;
  }
  pJVar2 = s->cur_func;
  if (iVar8 == -0x7d) {
    if (((s->token).u.ident.atom == 0x85) && ((s->token).u.ident.has_escape == 0)) {
      local_48 = s->buf_ptr;
      iVar8 = simple_next_token(&local_48,1);
      if (iVar8 == -0x3b) goto LAB_001511ab;
      iVar8 = (s->token).val;
      goto LAB_001511d3;
    }
  }
  else {
LAB_001511d3:
    if (iVar8 == -0x33) {
      if (pJVar2->module != (JSModuleDef *)0x0) {
        local_48 = s->buf_ptr;
        iVar8 = simple_next_token(&local_48,0);
        if ((iVar8 != 0x28) && (iVar8 != 0x2e)) {
          ctx = s->ctx;
          pJVar3 = s->cur_func->module;
          iVar8 = next_token(s);
          if (iVar8 != 0) {
            return -1;
          }
          lVar16 = (long)pJVar3->import_entries_count;
          iVar8 = (s->token).val;
          if (iVar8 == -0x7d) {
            if ((s->token).u.ident.is_reserved != 0) {
              js_parse_error_reserved_identifier(s);
              return -1;
            }
            JVar10 = (s->token).u.ident.atom;
            if (0xd1 < (long)(int)JVar10) {
              pJVar4 = ctx->rt->atom_array[(int)JVar10];
              (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            }
            iVar8 = next_token(s);
            import_name = 0x16;
            if (iVar8 == 0) {
              import_name = 0x16;
              iVar8 = add_import(s,pJVar3,JVar10,0x16);
              if (iVar8 == 0) {
                JS_FreeAtom(ctx,JVar10);
                if ((s->token).val == 0x2c) {
                  iVar8 = next_token(s);
                  if (iVar8 != 0) {
                    return -1;
                  }
                  iVar8 = (s->token).val;
                  goto LAB_00151832;
                }
                goto LAB_001519bc;
              }
            }
LAB_00151588:
            JS_FreeAtom(ctx,JVar10);
            goto LAB_00151593;
          }
          if (iVar8 == -0x7f) {
            import_name = JS_ValueToAtom(ctx,(s->token).u.str.str);
            if (import_name == 0) {
              return -1;
            }
            iVar8 = next_token(s);
            if (iVar8 != 0) goto LAB_00151593;
          }
          else {
LAB_00151832:
            if (iVar8 == 0x7b) {
              do {
                iVar8 = next_token(s);
                if (iVar8 != 0) {
                  return -1;
                }
                iVar8 = (s->token).val;
                if (iVar8 == 0x7d) break;
                if (iVar8 + 0x27U < 0xffffffd2 && iVar8 != -0x7d) goto LAB_00151c0a;
                import_name = (s->token).u.ident.atom;
                lVar13 = (long)(int)import_name;
                if (0xd1 < lVar13) {
                  pJVar4 = ctx->rt->atom_array[lVar13];
                  (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
                }
                iVar8 = next_token(s);
                JVar10 = 0;
                if (iVar8 != 0) goto LAB_00151588;
                if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x79)) &&
                   ((s->token).u.ident.has_escape == 0)) {
                  iVar8 = next_token(s);
                  if (iVar8 != 0) goto LAB_00151588;
                  iVar8 = (s->token).val;
                  if (iVar8 + 0x27U < 0xffffffd2 && iVar8 != -0x7d) {
                    JVar10 = 0;
                    js_parse_error(s,"identifier expected");
                    goto LAB_00151588;
                  }
                  JVar10 = (s->token).u.ident.atom;
                  if (0xd1 < (long)(int)JVar10) {
                    pJVar4 = ctx->rt->atom_array[(int)JVar10];
                    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
                  }
                  iVar8 = next_token(s);
                  if (iVar8 != 0) goto LAB_00151588;
                }
                else {
                  JVar10 = import_name;
                  if (0xd1 < (int)import_name) {
                    pJVar4 = ctx->rt->atom_array[lVar13];
                    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
                  }
                }
                iVar8 = add_import(s,pJVar3,JVar10,import_name);
                if (iVar8 != 0) goto LAB_00151588;
                JS_FreeAtom(ctx,JVar10);
                JS_FreeAtom(ctx,import_name);
              } while ((s->token).val == 0x2c);
              iVar8 = js_parse_expect(s,0x7d);
              if (iVar8 != 0) {
                return -1;
              }
            }
            else if (iVar8 == 0x2a) {
              iVar8 = next_token(s);
              if (iVar8 != 0) {
                return -1;
              }
              if ((((s->token).val != -0x7d) || ((s->token).u.ident.atom != 0x79)) ||
                 ((s->token).u.ident.has_escape != 0)) {
                fmt = "expecting \'as\'";
                goto LAB_00151c11;
              }
              iVar8 = next_token(s);
              if (iVar8 != 0) {
                return -1;
              }
              iVar8 = (s->token).val;
              if (0xffffffd1 < iVar8 + 0x27U || iVar8 == -0x7d) {
                JVar10 = (s->token).u.ident.atom;
                if (0xd1 < (long)(int)JVar10) {
                  pJVar4 = ctx->rt->atom_array[(int)JVar10];
                  (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
                }
                iVar8 = next_token(s);
                import_name = 0x7d;
                if (iVar8 == 0) {
                  import_name = 0x7d;
                  iVar8 = add_import(s,pJVar3,JVar10,0x7d);
                  if (iVar8 == 0) {
                    JS_FreeAtom(ctx,JVar10);
                    goto LAB_001519bc;
                  }
                }
                goto LAB_00151588;
              }
LAB_00151c0a:
              fmt = "identifier expected";
              goto LAB_00151c11;
            }
LAB_001519bc:
            import_name = js_parse_from_clause(s);
            if (import_name == 0) {
              return -1;
            }
          }
          iVar8 = add_req_module_entry(ctx,pJVar3,import_name);
          JS_FreeAtom(ctx,import_name);
          auVar7 = _DAT_0018f3e0;
          auVar6 = _DAT_0018f3d0;
          auVar5 = _DAT_0018f3c0;
          if (iVar8 < 0) {
            return -1;
          }
          if ((int)lVar16 < pJVar3->import_entries_count) {
            lVar13 = pJVar3->import_entries_count - lVar16;
            lVar14 = lVar13 + -1;
            auVar17._8_4_ = (int)lVar14;
            auVar17._0_8_ = lVar14;
            auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
            piVar15 = &pJVar3->import_entries[lVar16 + 3].req_module_idx;
            uVar11 = 0;
            auVar17 = auVar17 ^ _DAT_0018f3e0;
            do {
              auVar18._8_4_ = (int)uVar11;
              auVar18._0_8_ = uVar11;
              auVar18._12_4_ = (int)(uVar11 >> 0x20);
              auVar19 = (auVar18 | auVar6) ^ auVar7;
              iVar9 = auVar17._4_4_;
              if ((bool)(~(auVar19._4_4_ == iVar9 && auVar17._0_4_ < auVar19._0_4_ ||
                          iVar9 < auVar19._4_4_) & 1)) {
                piVar15[-9] = iVar8;
              }
              if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
                  auVar19._12_4_ <= auVar17._12_4_) {
                piVar15[-6] = iVar8;
              }
              auVar18 = (auVar18 | auVar5) ^ auVar7;
              iVar20 = auVar18._4_4_;
              if (iVar20 <= iVar9 && (iVar20 != iVar9 || auVar18._0_4_ <= auVar17._0_4_)) {
                piVar15[-3] = iVar8;
                *piVar15 = iVar8;
              }
              uVar11 = uVar11 + 4;
              piVar15 = piVar15 + 0xc;
            } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar11);
          }
          goto LAB_00151afd;
        }
      }
    }
    else if ((iVar8 == -0x35) && (pJVar2->module != (JSModuleDef *)0x0)) {
      ctx = s->ctx;
      pJVar3 = s->cur_func->module;
      iVar8 = next_token(s);
      if (iVar8 != 0) {
        return -1;
      }
      iVar8 = (s->token).val;
      if (iVar8 != -0x7d) {
        if (iVar8 != -0x3b) {
          if (iVar8 != -0x38) goto LAB_0015134e;
          export_flag = JS_PARSE_EXPORT_NAMED;
LAB_00151233:
          iVar8 = js_parse_class(s,0,export_flag);
          goto LAB_00151273;
        }
LAB_00151327:
        JVar10 = (JSAtom)(s->token).ptr;
        uVar1 = (s->token).line_num;
        iVar8 = 1;
LAB_00151344:
        iVar8 = js_parse_function_decl2
                          (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,JVar10,(uint8_t *)(ulong)uVar1,
                           iVar8,JS_PARSE_EXPORT_NONE,in_stack_ffffffffffffffb0);
        goto LAB_00151273;
      }
      if (((s->token).u.ident.atom == 0x85) && ((s->token).u.ident.has_escape == 0)) {
        local_48 = s->buf_ptr;
        iVar9 = simple_next_token(&local_48,1);
        if (iVar9 == -0x3b) goto LAB_00151327;
      }
LAB_0015134e:
      iVar9 = next_token(s);
      if (iVar9 != 0) {
        return -1;
      }
      if (iVar8 < -0x2f) {
        if (iVar8 != -0x4f) {
          if (iVar8 == -0x40) {
            iVar8 = (s->token).val;
            if (iVar8 == -0x7d) {
              if (((s->token).u.ident.atom == 0x85) && ((s->token).u.ident.has_escape == 0)) {
                local_48 = s->buf_ptr;
                iVar8 = simple_next_token(&local_48,1);
                if (iVar8 == -0x3b) goto LAB_00151727;
              }
            }
            else {
              if (iVar8 == -0x3b) {
LAB_00151727:
                JVar10 = (JSAtom)(s->token).ptr;
                uVar1 = (s->token).line_num;
                iVar8 = 2;
                goto LAB_00151344;
              }
              if (iVar8 == -0x38) {
                export_flag = JS_PARSE_EXPORT_DEFAULT;
                goto LAB_00151233;
              }
            }
            iVar8 = js_parse_assign_expr2(s,1);
            if (iVar8 != 0) {
              return -1;
            }
            set_object_name(s,0x16);
            iVar8 = define_var(s,s->cur_func,0x7c,JS_VAR_DEF_LET);
            if (iVar8 < 0) {
              return -1;
            }
            emit_op(s,0xbb);
            local_48 = (uint8_t *)CONCAT44(local_48._4_4_,0x7c);
            dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_48,4);
            local_48 = (uint8_t *)((ulong)local_48 & 0xffffffffffff0000);
            dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_48,2);
            pJVar12 = add_export_entry2(s->ctx,s,pJVar3,0x7c,0x16,JS_EXPORT_TYPE_LOCAL);
            if (pJVar12 == (JSExportEntry *)0x0) {
              return -1;
            }
            goto LAB_00151afd;
          }
          if (iVar8 != -0x37) {
LAB_0015159d:
            fmt = "invalid export syntax";
LAB_00151c11:
            js_parse_error(s,fmt);
            return -1;
          }
        }
      }
      else if (iVar8 != -0x2f) {
        if (iVar8 == 0x2a) {
          if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x79)) &&
             ((s->token).u.ident.has_escape == 0)) {
            iVar8 = next_token(s);
            if (iVar8 != 0) {
              return -1;
            }
            iVar8 = (s->token).val;
            if (iVar8 + 0x27U < 0xffffffd2 && iVar8 != -0x7d) goto LAB_00151c0a;
            import_name = (s->token).u.ident.atom;
            if (0xd1 < (long)(int)import_name) {
              pJVar4 = ctx->rt->atom_array[(int)import_name];
              (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            }
            iVar8 = next_token(s);
            if ((iVar8 != 0) || (JVar10 = js_parse_from_clause(s), JVar10 == 0)) {
LAB_00151593:
              JS_FreeAtom(ctx,import_name);
              return -1;
            }
            local_38 = ctx;
            iVar8 = add_req_module_entry(ctx,pJVar3,JVar10);
            JS_FreeAtom(local_38,JVar10);
            if (iVar8 < 0) goto LAB_00151593;
            pJVar12 = add_export_entry2(s->ctx,s,pJVar3,0x7d,import_name,JS_EXPORT_TYPE_INDIRECT);
            JS_FreeAtom(ctx,import_name);
            if (pJVar12 == (JSExportEntry *)0x0) {
              return -1;
            }
            (pJVar12->u).local.var_idx = iVar8;
          }
          else {
            JVar10 = js_parse_from_clause(s);
            if (JVar10 == 0) {
              return -1;
            }
            iVar8 = add_req_module_entry(ctx,pJVar3,JVar10);
            JS_FreeAtom(ctx,JVar10);
            if (iVar8 < 0) {
              return -1;
            }
            iVar8 = add_star_export_entry(ctx,pJVar3,iVar8);
            if (iVar8 < 0) {
              return -1;
            }
          }
        }
        else {
          if (iVar8 != 0x7b) goto LAB_0015159d;
          local_40 = (long)pJVar3->export_entries_count;
          while (iVar8 = (s->token).val, iVar8 != 0x7d) {
            if (iVar8 + 0x27U < 0xffffffd2 && iVar8 != -0x7d) goto LAB_00151c0a;
            JVar10 = (s->token).u.ident.atom;
            lVar16 = (long)(int)JVar10;
            if (0xd1 < lVar16) {
              pJVar4 = ctx->rt->atom_array[lVar16];
              (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            }
            iVar8 = next_token(s);
            import_name = 0;
            if (iVar8 != 0) goto LAB_00151588;
            if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x79)) &&
               ((s->token).u.ident.has_escape == 0)) {
              iVar8 = next_token(s);
              import_name = 0;
              if (iVar8 != 0) goto LAB_00151588;
              iVar8 = (s->token).val;
              if (iVar8 + 0x27U < 0xffffffd2 && iVar8 != -0x7d) {
                js_parse_error(s,"identifier expected");
                import_name = 0;
                goto LAB_00151588;
              }
              import_name = (s->token).u.ident.atom;
              if (0xd1 < (long)(int)import_name) {
                pJVar4 = ctx->rt->atom_array[(int)import_name];
                (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
              }
              iVar8 = next_token(s);
              if (iVar8 != 0) goto LAB_00151588;
            }
            else {
              import_name = JVar10;
              if (0xd1 < (int)JVar10) {
                pJVar4 = ctx->rt->atom_array[lVar16];
                (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
              }
            }
            pJVar12 = add_export_entry2(s->ctx,s,pJVar3,JVar10,import_name,JS_EXPORT_TYPE_LOCAL);
            JS_FreeAtom(ctx,JVar10);
            JS_FreeAtom(ctx,import_name);
            if (pJVar12 == (JSExportEntry *)0x0) {
              return -1;
            }
            if ((s->token).val != 0x2c) break;
            iVar8 = next_token(s);
            if (iVar8 != 0) {
              return -1;
            }
          }
          iVar8 = js_parse_expect(s,0x7d);
          if (iVar8 != 0) {
            return -1;
          }
          if ((((s->token).val == -0x7d) && ((s->token).u.ident.atom == 0x7a)) &&
             ((s->token).u.ident.has_escape == 0)) {
            JVar10 = js_parse_from_clause(s);
            if (JVar10 == 0) {
              return -1;
            }
            iVar8 = add_req_module_entry(ctx,pJVar3,JVar10);
            JS_FreeAtom(ctx,JVar10);
            if (iVar8 < 0) {
              return -1;
            }
            if ((int)local_40 < pJVar3->export_entries_count) {
              uVar11 = local_40 << 5 | 0x10;
              do {
                pJVar12 = pJVar3->export_entries;
                *(undefined4 *)((long)&pJVar12->u + uVar11) = 1;
                *(int *)((long)pJVar12 + (uVar11 - 0x10)) = iVar8;
                local_40 = local_40 + 1;
                uVar11 = uVar11 + 0x20;
              } while (local_40 < pJVar3->export_entries_count);
            }
          }
        }
LAB_00151afd:
        iVar8 = js_parse_expect_semi(s);
        goto LAB_00151273;
      }
      iVar8 = js_parse_var(s,1,iVar8,1);
      goto LAB_00151273;
    }
  }
  iVar8 = js_parse_statement_or_decl(s,7);
LAB_00151273:
  iVar9 = -1;
  if (iVar8 == 0) {
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static __exception int js_parse_source_element(JSParseState *s)
{
    JSFunctionDef *fd = s->cur_func;
    int tok;
    
    if (s->token.val == TOK_FUNCTION ||
        (token_is_pseudo_keyword(s, JS_ATOM_async) &&
         peek_token(s, TRUE) == TOK_FUNCTION)) {
        if (js_parse_function_decl(s, JS_PARSE_FUNC_STATEMENT,
                                   JS_FUNC_NORMAL, JS_ATOM_NULL,
                                   s->token.ptr, s->token.line_num))
            return -1;
    } else if (s->token.val == TOK_EXPORT && fd->module) {
        if (js_parse_export(s))
            return -1;
    } else if (s->token.val == TOK_IMPORT && fd->module &&
               ((tok = peek_token(s, FALSE)) != '(' && tok != '.'))  {
        /* the peek_token is needed to avoid confusion with ImportCall
           (dynamic import) or import.meta */
        if (js_parse_import(s))
            return -1;
    } else {
        if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
            return -1;
    }
    return 0;
}